

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O2

void chaiscript::Module::
     apply_eval<chaiscript::ChaiScript_Basic,__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                begin,__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      end,ChaiScript_Basic *t)

{
  allocator<char> local_79;
  undefined1 local_78 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50 [32];
  
  for (; begin._M_current != end._M_current; begin._M_current = begin._M_current + 1) {
    local_78._0_8_ = (pointer)0x0;
    local_78._8_8_ = 0;
    std::__cxx11::string::string<std::allocator<char>>(local_50,"__EVAL__",&local_79);
    ChaiScript_Basic::eval
              ((ChaiScript_Basic *)(local_78 + 0x18),(string *)t,
               (Exception_Handler *)begin._M_current,(string *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
    std::__cxx11::string::~string(local_50);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  }
  return;
}

Assistant:

static void apply_eval(InItr begin, InItr end, T &t) {
      while (begin != end) {
        t.eval(*begin);
        ++begin;
      }
    }